

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O3

HTS_Boolean HTS_get_pattern_token(HTS_File *fp,char *buff)

{
  char cVar1;
  HTS_Boolean HVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  
  if (fp == (HTS_File *)0x0) {
    return '\0';
  }
  do {
    iVar3 = HTS_feof(fp);
    if (iVar3 != 0) goto LAB_00176de0;
    uVar4 = HTS_fgetc(fp);
    iVar3 = uVar4 << 0x18;
  } while ((iVar3 == 0x20000000) || (iVar3 == 0xa000000));
  if (iVar3 == 0x27000000) {
    iVar5 = HTS_feof(fp);
    if (iVar5 == 0) {
      uVar4 = HTS_fgetc(fp);
      goto LAB_00176dca;
    }
LAB_00176de0:
    HVar2 = '\0';
  }
  else {
LAB_00176dca:
    cVar1 = (char)uVar4;
    uVar4 = uVar4 & 0xff;
    if (uVar4 == 0x22) {
      iVar5 = HTS_feof(fp);
      if (iVar5 != 0) goto LAB_00176de0;
      iVar5 = HTS_fgetc(fp);
      cVar1 = (char)iVar5;
    }
    if (cVar1 == ',') {
      buff[0] = ',';
      buff[1] = '\0';
    }
    else {
      *buff = cVar1;
      iVar5 = HTS_fgetc(fp);
      iVar6 = iVar5 << 0x18;
      lVar7 = 1;
      if ((iVar6 != 0x27000000 || iVar3 != 0x27000000) &&
         (iVar6 != 0x22000000 || (uVar4 ^ 0x22) != 0)) {
        while ((iVar3 == 0x27000000 || uVar4 == 0x22 ||
               (((iVar6 != 0xa000000 && (iVar6 != 0x20000000)) && (iVar6 = HTS_feof(fp), iVar6 == 0)
                )))) {
          buff[lVar7] = (char)iVar5;
          lVar7 = lVar7 + 1;
          iVar5 = HTS_fgetc(fp);
          iVar6 = iVar5 << 0x18;
          if ((iVar6 == 0x27000000 && iVar3 == 0x27000000) ||
             (iVar6 == 0x22000000 && (uVar4 ^ 0x22) == 0)) break;
        }
      }
      buff[lVar7] = '\0';
    }
    HVar2 = '\x01';
  }
  return HVar2;
}

Assistant:

HTS_Boolean HTS_get_pattern_token(HTS_File * fp, char *buff)
{
   char c;
   size_t i;
   HTS_Boolean squote = FALSE, dquote = FALSE;

   if (fp == NULL || HTS_feof(fp))
      return FALSE;
   c = HTS_fgetc(fp);

   while (c == ' ' || c == '\n') {
      if (HTS_feof(fp))
         return FALSE;
      c = HTS_fgetc(fp);
   }

   if (c == '\'') {             /* single quote case */
      if (HTS_feof(fp))
         return FALSE;
      c = HTS_fgetc(fp);
      squote = TRUE;
   }

   if (c == '\"') {             /*double quote case */
      if (HTS_feof(fp))
         return FALSE;
      c = HTS_fgetc(fp);
      dquote = TRUE;
   }

   if (c == ',') {              /*special character ',' */
      strcpy(buff, ",");
      return TRUE;
   }

   i = 0;
   while (1) {
      buff[i++] = c;
      c = HTS_fgetc(fp);
      if (squote && c == '\'')
         break;
      if (dquote && c == '\"')
         break;
      if (!squote && !dquote) {
         if (c == ' ')
            break;
         if (c == '\n')
            break;
         if (HTS_feof(fp))
            break;
      }
   }

   buff[i] = '\0';
   return TRUE;
}